

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

void __thiscall BoardView::CenterZoomNet(BoardView *this,string *netname)

{
  long *plVar1;
  long lVar2;
  __type _Var3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var_01;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined8 *extraout_RAX;
  shared_ptr<Pin> *pin;
  long *plVar7;
  undefined1 auVar8 [16];
  float fVar10;
  float fVar11;
  float fVar15;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 *puVar6;
  float fVar9;
  
  if ((this->config).infoPanelCenterZoomNets == true) {
    iVar5 = (*this->m_board->_vptr_Board[4])();
    puVar6 = (undefined8 *)CONCAT44(extraout_var_01,iVar5);
    plVar1 = (long *)puVar6[1];
    auVar13 = _DAT_001b86e0;
    auVar17 = _DAT_001b86f0;
    for (plVar7 = (long *)*puVar6; plVar7 != plVar1; plVar7 = plVar7 + 2) {
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(long *)(*plVar7 + 0x60) + 0x10),netname);
      puVar6 = (undefined8 *)CONCAT71(extraout_var,_Var3);
      if (_Var3) {
        lVar2 = *plVar7;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = *(ulong *)(lVar2 + 0x50);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = *(ulong *)(lVar2 + 0x50);
        auVar17 = minps(auVar16,auVar17);
        auVar13 = maxps(auVar12,auVar13);
        if (((this->config).infoPanelSelectPartsOnNet == true) && (*(int *)(lVar2 + 0xc) != 4)) {
          bVar4 = contains<std::shared_ptr<Component>>
                            ((shared_ptr<Component> *)(lVar2 + 0x68),&this->m_partHighlighted);
          puVar6 = (undefined8 *)CONCAT71(extraout_var_00,bVar4);
          if (!bVar4) {
            lVar2 = *plVar7;
            *(undefined1 *)(*(long *)(lVar2 + 0x68) + 0xe0) = 1;
            std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
            push_back(&this->m_partHighlighted,(value_type *)(lVar2 + 0x68));
            puVar6 = extraout_RAX;
          }
        }
      }
    }
    fVar11 = auVar17._0_4_;
    fVar15 = auVar17._4_4_;
    fVar10 = auVar13._0_4_;
    fVar9 = auVar13._4_4_;
    auVar8._4_4_ = -(uint)(fVar15 == 3.4028235e+38);
    auVar8._0_4_ = -(uint)(fVar11 == 3.4028235e+38);
    auVar8._8_4_ = -(uint)(fVar10 == 1.1754944e-38);
    auVar8._12_4_ = -(uint)(fVar9 == 1.1754944e-38);
    iVar5 = movmskps((int)puVar6,auVar8);
    if (iVar5 == 0) {
      if (this->debug == true) {
        fprintf(_stderr,"CenterzoomNet: bbox[%d]: %0.1f %0.1f - %0.1f %0.1f\n",(double)fVar11,
                (double)fVar15,(double)fVar10,SUB84((double)fVar9,0),0);
      }
      auVar14._0_4_ = fVar10 - fVar11;
      auVar14._4_4_ = fVar9 - fVar15;
      auVar14._8_4_ = auVar13._8_4_ - auVar17._8_4_;
      auVar14._12_4_ = auVar13._12_4_ - auVar17._12_4_;
      auVar13._8_8_ = 0;
      auVar13._0_4_ = (this->m_board_surface).x;
      auVar13._4_4_ = (this->m_board_surface).y;
      auVar13 = divps(auVar13,auVar14);
      fVar10 = (float)(~-(uint)(0.0 < auVar14._0_4_) & 0x7f7fffff |
                      auVar13._0_4_ & -(uint)(0.0 < auVar14._0_4_));
      fVar9 = (float)(~-(uint)(0.0 < auVar14._4_4_) & 0x7f7fffff |
                     auVar13._4_4_ & -(uint)(0.0 < auVar14._4_4_));
      if (fVar9 <= fVar10) {
        fVar10 = fVar9;
      }
      fVar9 = this->m_scale_floor;
      fVar10 = (float)(-(uint)(fVar10 == 3.4028235e+38) & (uint)fVar9 |
                      ~-(uint)(fVar10 == 3.4028235e+38) & (uint)fVar10) /
               (this->config).partZoomScaleOutFactor;
      if (fVar9 <= fVar10) {
        fVar9 = fVar10;
      }
      this->m_scale = fVar9;
      fVar11 = auVar14._0_4_ * 0.5 + fVar11;
      fVar15 = auVar14._4_4_ * 0.5 + fVar15;
      this->m_dx = fVar11;
      this->m_dy = fVar15;
      SetTarget(this,fVar11,fVar15);
      this->m_needsRedraw = true;
    }
  }
  return;
}

Assistant:

void BoardView::CenterZoomNet(std::string netname) {
	ImVec2 view = m_board_surface;
	ImVec2 min, max;
	int i = 0;

	if (!config.infoPanelCenterZoomNets) return;

	min.x = min.y = FLT_MAX;
	max.x = max.y = FLT_MIN;

	for (auto &pin : m_board->Pins()) {
		if (pin->net->name == netname) {
			auto p = pin->position;
			if (p.x < min.x) min.x = p.x;
			if (p.y < min.y) min.y = p.y;
			if (p.x > max.x) max.x = p.x;
			if (p.y > max.y) max.y = p.y;

			if ((config.infoPanelSelectPartsOnNet) && (pin->type != Pin::kPinTypeTestPad)) {
				if (!contains(pin->component, m_partHighlighted)) {
					pin->component->visualmode = pin->component->CVMSelected;
					m_partHighlighted.push_back(pin->component);
				}
			}
		}
	}

	// Bounds check!
	if ((min.x == FLT_MAX) || (min.y == FLT_MAX) || (max.x == FLT_MIN) || (max.y == FLT_MIN)) return;

	if (debug) fprintf(stderr, "CenterzoomNet: bbox[%d]: %0.1f %0.1f - %0.1f %0.1f\n", i, min.x, min.y, max.x, max.y);

	float dx = (max.x - min.x);
	float dy = (max.y - min.y);
	float sx = dx > 0 ? view.x / dx : FLT_MAX;
	float sy = dy > 0 ? view.y / dy : FLT_MAX;

	m_scale = sx < sy ? sx : sy;
	if (m_scale == FLT_MAX) m_scale = m_scale_floor;
	m_scale /= config.partZoomScaleOutFactor;
	if (m_scale < m_scale_floor) m_scale = m_scale_floor;

	/*
	float dx = (max.x - min.x);
	float dy = (max.y - min.y);
	float sx = dx > 0 ? view.x / dx : 1.0f;
	float sy = dy > 0 ? view.y / dy : 1.0f;

	//  m_rotation = 0;
	m_scale = sx < sy ? sx : sy;
	m_scale /= config.partZoomScaleOutFactor;
	if (m_scale < m_scale_floor) m_scale = m_scale_floor;
	*/

	m_dx = (max.x - min.x) / 2 + min.x;
	m_dy = (max.y - min.y) / 2 + min.y;
	SetTarget(m_dx, m_dy);
	m_needsRedraw = true;
}